

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleDependenciesTests.cpp
# Opt level: O0

void __thiscall
glcts::MultisampleTextureDependenciesFBOIncompleteness2Test::deinit
          (MultisampleTextureDependenciesFBOIncompleteness2Test *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  MultisampleTextureDependenciesFBOIncompleteness2Test *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  if (this->fbo_id != 0) {
    (**(code **)(lVar3 + 0x440))(1,&this->fbo_id);
    this->fbo_id = 0;
  }
  if (this->to_id_2d != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->to_id_2d);
    this->to_id_2d = 0;
  }
  if (this->to_id_multisample_2d != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->to_id_multisample_2d);
    this->to_id_multisample_2d = 0;
  }
  if (this->to_id_multisample_2d_array != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->to_id_multisample_2d_array);
    this->to_id_multisample_2d_array = 0;
  }
  tcu::TestNode::deinit((TestNode *)this);
  return;
}

Assistant:

void MultisampleTextureDependenciesFBOIncompleteness2Test::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (fbo_id != 0)
	{
		gl.deleteFramebuffers(1, &fbo_id);

		fbo_id = 0;
	}

	if (to_id_2d != 0)
	{
		gl.deleteTextures(1, &to_id_2d);

		to_id_2d = 0;
	}

	if (to_id_multisample_2d != 0)
	{
		gl.deleteTextures(1, &to_id_multisample_2d);

		to_id_multisample_2d = 0;
	}

	if (to_id_multisample_2d_array != 0)
	{
		gl.deleteTextures(1, &to_id_multisample_2d_array);

		to_id_multisample_2d_array = 0;
	}

	/* Call base class' deinit() */
	TestCase::deinit();
}